

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

void cf2_builder_lineTo(CF2_OutlineCallbacks callbacks,CF2_CallbackParams params)

{
  PS_Builder *builder_00;
  FT_Error FVar1;
  PS_Builder *builder;
  CF2_Outline outline;
  FT_Error error;
  CF2_CallbackParams params_local;
  CF2_OutlineCallbacks callbacks_local;
  
  builder_00 = (PS_Builder *)callbacks[1].moveTo;
  if ((builder_00->path_begun == '\0') &&
     (FVar1 = ps_builder_start_point(builder_00,(params->pt0).x,(params->pt0).y), FVar1 != 0)) {
    if (*callbacks->error == 0) {
      *callbacks->error = FVar1;
    }
  }
  else {
    FVar1 = ps_builder_add_point1(builder_00,(params->pt1).x,(params->pt1).y);
    if ((FVar1 != 0) && (*callbacks->error == 0)) {
      *callbacks->error = FVar1;
    }
  }
  return;
}

Assistant:

static void
  cf2_builder_lineTo( CF2_OutlineCallbacks      callbacks,
                      const CF2_CallbackParams  params )
  {
    FT_Error  error;

    /* downcast the object pointer */
    CF2_Outline  outline = (CF2_Outline)callbacks;
    PS_Builder*  builder;


    FT_ASSERT( outline && outline->decoder );
    FT_ASSERT( params->op == CF2_PathOpLineTo );

    builder = &outline->decoder->builder;

    if ( !builder->path_begun )
    {
      /* record the move before the line; also check points and set */
      /* `path_begun'                                               */
      error = ps_builder_start_point( builder,
                                      params->pt0.x,
                                      params->pt0.y );
      if ( error )
      {
        if ( !*callbacks->error )
          *callbacks->error =  error;
        return;
      }
    }

    /* `ps_builder_add_point1' includes a check_points call for one point */
    error = ps_builder_add_point1( builder,
                                   params->pt1.x,
                                   params->pt1.y );
    if ( error )
    {
      if ( !*callbacks->error )
        *callbacks->error =  error;
      return;
    }
  }